

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall miniros::TransportTCP::TransportTCP(TransportTCP *this,PollSet *poll_set,int flags)

{
  Transport::Transport(&this->super_Transport);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__TransportTCP_002f24b0;
  this->sock_ = -1;
  this->closed_ = false;
  *(undefined8 *)((long)&(this->close_mutex_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->close_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->close_mutex_).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->close_mutex_).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->close_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->close_mutex_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  this->expecting_read_ = false;
  this->expecting_write_ = false;
  this->is_server_ = false;
  this->server_port_ = -1;
  this->local_port_ = -1;
  *(undefined8 *)&(this->accept_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->accept_cb_).super__Function_base._M_functor + 8) = 0;
  (this->accept_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->accept_cb_)._M_invoker = (_Invoker_type)0x0;
  (this->cached_remote_host_)._M_dataplus._M_p = (pointer)&(this->cached_remote_host_).field_2;
  (this->cached_remote_host_)._M_string_length = 0;
  (this->cached_remote_host_).field_2._M_local_buf[0] = '\0';
  this->poll_set_ = poll_set;
  this->flags_ = flags;
  (this->connected_host_)._M_dataplus._M_p = (pointer)&(this->connected_host_).field_2;
  (this->connected_host_)._M_string_length = 0;
  (this->connected_host_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TransportTCP::TransportTCP(PollSet* poll_set, int flags)
: sock_(ROS_INVALID_SOCKET)
, closed_(false)
, expecting_read_(false)
, expecting_write_(false)
, is_server_(false)
, server_port_(-1)
, local_port_(-1)
, poll_set_(poll_set)
, flags_(flags)
{

}